

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

uint8 * rw::getFileContents(char *name,uint32 *len)

{
  FILE *__stream;
  long lVar1;
  uint8 *data;
  FILE *cf;
  uint32 *len_local;
  char *name_local;
  
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    *len = (uint32)lVar1;
    fseek(__stream,0,0);
    name_local = (char *)mustmalloc_LOC((ulong)*len,0x30000,
                                        "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/base.cpp line: 1115"
                                       );
    fread(name_local,1,(ulong)*len,__stream);
    fclose(__stream);
  }
  return (uint8 *)name_local;
}

Assistant:

uint8*
getFileContents(const char *name, uint32 *len)
{
	FILE *cf = fopen(name, "rb");
	if(cf == nil)
		return nil;
	fseek(cf, 0, SEEK_END);
	*len = ftell(cf);
	fseek(cf, 0, SEEK_SET);
	uint8 *data = rwNewT(uint8, *len, MEMDUR_EVENT);
	fread(data, 1, *len, cf);
	fclose(cf);
	return data;
}